

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O3

void vkt::sr::anon_unknown_0::MatrixCaseUtils::Evaluator<6,_7,_94>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  undefined8 uVar1;
  undefined8 uVar2;
  bool bVar3;
  bool bVar4;
  long lVar5;
  float *pfVar6;
  int col;
  long lVar7;
  float fVar8;
  Matrix<float,_2,_4> res;
  Type in0;
  float local_28 [4];
  int aiStack_18 [6];
  
  if (in0Type == INPUTTYPE_DYNAMIC) {
    in0.m_data.m_data[0].m_data._0_8_ = *(undefined8 *)evalCtx->in[0].m_data;
    in0.m_data.m_data[0].m_data._8_8_ = *(undefined8 *)(evalCtx->in[0].m_data + 2);
    in0.m_data.m_data[1].m_data[0] = evalCtx->in[1].m_data[0];
    in0.m_data.m_data[1].m_data[1] = evalCtx->in[1].m_data[1];
    in0.m_data.m_data[1].m_data[2] = evalCtx->in[1].m_data[2];
    in0.m_data.m_data[1].m_data[3] = evalCtx->in[1].m_data[3];
  }
  else {
    in0.m_data.m_data[0].m_data[0] = -0.6;
    in0.m_data.m_data[0].m_data[1] = -0.6;
    in0.m_data.m_data[0].m_data[2] = -0.2;
    in0.m_data.m_data[0].m_data[3] = -0.1;
    in0.m_data.m_data[1].m_data[0] = -1.1;
    in0.m_data.m_data[1].m_data[1] = -0.6;
    in0.m_data.m_data[1].m_data[2] = -0.6;
    in0.m_data.m_data[1].m_data[3] = -0.1;
  }
  lVar5 = 0;
  pfVar6 = (float *)&res;
  bVar3 = true;
  do {
    bVar4 = bVar3;
    lVar7 = 0;
    do {
      fVar8 = 1.0;
      if (lVar5 != lVar7) {
        fVar8 = 0.0;
      }
      pfVar6[lVar7 * 2] = fVar8;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 4);
    lVar5 = 1;
    pfVar6 = res.m_data.m_data[0].m_data + 1;
    bVar3 = false;
  } while (bVar4);
  lVar5 = 0;
  do {
    uVar1 = *(undefined8 *)(in0.m_data.m_data[0].m_data + lVar5);
    uVar2 = *(undefined8 *)(local_28 + lVar5 + -4);
    res.m_data.m_data[lVar5].m_data[0] = (float)uVar1;
    res.m_data.m_data[lVar5].m_data[1] = (float)uVar2;
    res.m_data.m_data[lVar5 + 1].m_data[0] = (float)((ulong)uVar1 >> 0x20);
    res.m_data.m_data[lVar5 + 1].m_data[1] = (float)((ulong)uVar2 >> 0x20);
    lVar5 = lVar5 + 2;
  } while (lVar5 != 4);
  aiStack_18[2] = 0;
  aiStack_18[3] = 1;
  aiStack_18[4] = 2;
  lVar5 = 2;
  do {
    (evalCtx->color).m_data[aiStack_18[lVar5]] = local_28[lVar5 + -2];
    lVar5 = lVar5 + 1;
  } while (lVar5 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		DE_UNREF(in1Type);
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		evalCtx.color.xyz() = reduceToVec3(transpose(in0));
	}